

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt,int i,int n)

{
  int iVar1;
  uint in_ESI;
  Vdbe *in_RDI;
  Vdbe *p;
  int rc;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = vdbeUnbind(in_RDI,in_ESI);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetZeroBlob((Mem *)in_RDI,in_stack_ffffffffffffffdc);
    sqlite3_mutex_leave((sqlite3_mutex *)0x141609);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt, int i, int n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
    assert( p!=0 && p->aVar!=0 && i>0 && i<=p->nVar ); /* tag-20240917-01 */
#ifndef SQLITE_OMIT_INCRBLOB
    sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
#else
    rc = sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
#endif
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}